

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDar(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar2;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
    pMan = Abc_NtkToDar(pNtk,0,0);
    if (pMan != (Aig_Man_t *)0x0) {
      pNtk_00 = Abc_NtkFromDar(pNtk,pMan);
      Aig_ManStop(pMan);
      if (pNtk_00 != (Abc_Ntk_t *)0x0) {
        pAVar2 = pNtk_00;
        iVar1 = Abc_NtkCheck(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print((int)pAVar2,"Abc_NtkDar: The network check has failed.\n");
          Abc_NtkDelete(pNtk_00);
          pNtk_00 = (Abc_Ntk_t *)0x0;
        }
      }
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x56f,"Abc_Ntk_t *Abc_NtkDar(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDar( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkAig = NULL;
    Aig_Man_t * pMan;
    extern void Fra_ManPartitionTest( Aig_Man_t * p, int nComLim );

    assert( Abc_NtkIsStrash(pNtk) );
    // convert to the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;

    // perform computation
//    Fra_ManPartitionTest( pMan, 4 );
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pMan );

    // make sure everything is okay
    if ( pNtkAig && !Abc_NtkCheck( pNtkAig ) )
    {
        Abc_Print( 1, "Abc_NtkDar: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}